

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value-types.hh
# Opt level: O0

array<double,_4UL> * __thiscall
tinyusdz::value::MultV<tinyusdz::value::matrix4d,std::array<double,4ul>,double,double,4ul>
          (array<double,_4UL> *__return_storage_ptr__,value *this,matrix4d *m,array<double,_4UL> *v)

{
  double dVar1;
  const_reference pvVar2;
  reference pvVar3;
  ulong local_30;
  size_t i;
  Ty value;
  size_t j;
  array<double,_4UL> *v_local;
  matrix4d *m_local;
  
  for (value = 0.0; (ulong)value < 4; value = (Ty)((long)value + 1)) {
    i = 0;
    for (local_30 = 0; local_30 < 4; local_30 = local_30 + 1) {
      dVar1 = *(double *)(this + (long)value * 8 + local_30 * 0x20);
      pvVar2 = ::std::array<double,_4UL>::operator[]((array<double,_4UL> *)m,local_30);
      i = (size_t)(dVar1 * *pvVar2 + (double)i);
    }
    pvVar3 = ::std::array<double,_4UL>::operator[](__return_storage_ptr__,(size_type)value);
    *pvVar3 = (value_type_conflict2)i;
  }
  return __return_storage_ptr__;
}

Assistant:

VTy MultV(const MTy &m, const VTy &v) {
  // MBaseTy must be float or double
  // TODO: use std::enable_if?
  static_assert(std::is_same<MBaseTy, double>::value || std::is_same<MBaseTy, float>::value,
    "Matrix element type must be `float` or `double`");

  // Intermediate type. Choose higher precision based on its size.
  typedef typename std::conditional<sizeof(MBaseTy) >= sizeof(VBaseTy), MBaseTy, VBaseTy>::type Ty;

  VTy ret;

  for (size_t j = 0; j < N; j++) {
    Ty value = static_cast<Ty>(0);
    for (size_t i = 0; i < N; i++) {
      value += static_cast<Ty>(m.m[i][j]) * static_cast<Ty>(v[i]);
    }
    ret[j] = static_cast<VBaseTy>(value);
  }

  return ret;
}